

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O2

int unicode_prop1(CharRange *cr,int prop_idx)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  uint32_t c1;
  byte *pbVar7;
  uint uVar8;
  uint32_t uVar9;
  
  pbVar6 = unicode_prop_table[prop_idx];
  pbVar7 = pbVar6 + unicode_prop_len_table[prop_idx];
  c1 = 0;
  bVar4 = false;
  while( true ) {
    if (pbVar7 <= pbVar6) {
      return 0;
    }
    pbVar1 = pbVar6 + 1;
    bVar3 = *pbVar6;
    uVar8 = (uint)bVar3;
    if (bVar3 < 0x40) {
      uVar9 = c1 + (bVar3 >> 3) + 1;
      if ((bVar4) && (iVar5 = cr_add_interval(cr,c1,uVar9), iVar5 != 0)) {
        return -1;
      }
      bVar4 = (bool)(bVar4 ^ 1);
      pbVar6 = pbVar1;
      c1 = (uVar8 & 7) + uVar9 + 1;
    }
    else {
      uVar9 = c1;
      if ((char)bVar3 < '\0') {
        pbVar6 = pbVar1;
        c1 = (bVar3 + c1) - 0x7f;
      }
      else if (bVar3 < 0x60) {
        pbVar6 = pbVar6 + 2;
        c1 = (uVar8 * 0x100 + c1 + (uint)*pbVar1) - 0x3fff;
      }
      else {
        pbVar2 = pbVar6 + 2;
        pbVar6 = pbVar6 + 3;
        c1 = (uVar8 * 0x10000 + c1 + (uint)*pbVar1 * 0x100 + (uint)*pbVar2) - 0x5fffff;
      }
    }
    if ((bVar4) && (iVar5 = cr_add_interval(cr,uVar9,c1), iVar5 != 0)) break;
    bVar4 = (bool)(bVar4 ^ 1);
  }
  return -1;
}

Assistant:

static int unicode_prop1(CharRange *cr, int prop_idx)
{
    const uint8_t *p, *p_end;
    uint32_t c, c0, b, bit;

    p = unicode_prop_table[prop_idx];
    p_end = p + unicode_prop_len_table[prop_idx];
    c = 0;
    bit = 0;
    while (p < p_end) {
        c0 = c;
        b = *p++;
        if (b < 64) {
            c += (b >> 3) + 1;
            if (bit)  {
                if (cr_add_interval(cr, c0, c))
                    return -1;
            }
            bit ^= 1;
            c0 = c;
            c += (b & 7) + 1;
        } else if (b >= 0x80) {
            c += b - 0x80 + 1;
        } else if (b < 0x60) {
            c += (((b - 0x40) << 8) | p[0]) + 1;
            p++;
        } else {
            c += (((b - 0x60) << 16) | (p[0] << 8) | p[1]) + 1;
            p += 2;
        }
        if (bit)  {
            if (cr_add_interval(cr, c0, c))
                return -1;
        }
        bit ^= 1;
    }
    return 0;
}